

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

int gmath::anon_unknown_23::averageAngleAxisOpt(int n,double *x,int m,double *fvec,void *up)

{
  double dVar1;
  double dVar2;
  int i;
  long lVar3;
  undefined8 *puVar4;
  double (*padVar5) [3];
  ulong uVar6;
  long lVar7;
  double (*padVar8) [3];
  int j;
  long lVar9;
  void *pvVar10;
  double ret;
  SMatrix<double,_3,_3> ret_3;
  Vector3d tmp;
  Matrix33d R;
  Matrix33d Ra;
  Matrix33d local_128;
  Vector3d local_d8;
  double local_c0 [9];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_d8.v[0] = 0.0;
  local_d8.v[1] = 0.0;
  local_d8.v[2] = 0.0;
  local_128.v[0][0] = *x;
  local_128.v[0][1] = x[1];
  local_128.v[0][2] = x[2];
  dVar2 = 0.0;
  lVar3 = 0;
  do {
    dVar1 = local_128.v[0][lVar3];
    dVar2 = dVar2 + dVar1 * dVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  padVar8 = (double (*) [3])local_c0;
  createR((Matrix33d *)padVar8,(Vector3d *)&local_128,dVar2);
  puVar4 = &local_78;
  local_60 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_40 = 0;
  local_78 = 0x3ff0000000000000;
  uStack_58 = 0x3ff0000000000000;
  local_38 = 0x3ff0000000000000;
  lVar3 = 0;
  do {
    lVar7 = 0;
    padVar5 = padVar8;
    do {
      puVar4[lVar7] = (*(double (*) [3])*padVar5)[0];
      lVar7 = lVar7 + 1;
      padVar5 = padVar5 + 1;
    } while (lVar7 != 3);
    lVar3 = lVar3 + 1;
    puVar4 = puVar4 + 3;
    padVar8 = (double (*) [3])(*padVar8 + 1);
  } while (lVar3 != 3);
  if (0 < m) {
    uVar6 = 0;
    pvVar10 = up;
    do {
      lVar3 = 0;
      dVar2 = 0.0;
      do {
        dVar1 = *(double *)((long)pvVar10 + lVar3 * 8);
        dVar2 = dVar2 + dVar1 * dVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      createR((Matrix33d *)local_c0,(Vector3d *)((long)up + uVar6 * 0x18),dVar2);
      local_128.v[1][2] = 0.0;
      local_128.v[2][0] = 0.0;
      local_128.v[1][0] = 0.0;
      local_128.v[0][1] = 0.0;
      local_128.v[0][2] = 0.0;
      local_128.v[2][1] = 0.0;
      local_128.v[0][0] = 1.0;
      local_128.v[1][1] = 1.0;
      local_128.v[2][2] = 1.0;
      puVar4 = &local_78;
      lVar3 = 0;
      do {
        lVar7 = 0;
        padVar8 = (double (*) [3])local_c0;
        do {
          dVar2 = 0.0;
          lVar9 = 0;
          padVar5 = padVar8;
          do {
            dVar2 = dVar2 + (double)puVar4[lVar9] * (*(double (*) [3])*padVar5)[0];
            lVar9 = lVar9 + 1;
            padVar5 = padVar5 + 1;
          } while (lVar9 != 3);
          local_128.v[lVar3][lVar7] = dVar2;
          lVar7 = lVar7 + 1;
          padVar8 = (double (*) [3])(*padVar8 + 1);
        } while (lVar7 != 3);
        lVar3 = lVar3 + 1;
        puVar4 = puVar4 + 3;
      } while (lVar3 != 3);
      dVar2 = recoverAngleAxis(&local_128,&local_d8);
      fvec[uVar6] = dVar2;
      uVar6 = uVar6 + 1;
      pvVar10 = (void *)((long)pvVar10 + 0x18);
    } while (uVar6 != (uint)m);
  }
  return 0;
}

Assistant:

int averageAngleAxisOpt(int n, double x[], int m, double fvec[], void *up)
{
  Vector3d *v=reinterpret_cast<Vector3d *>(up);
  Vector3d tmp;

  Matrix33d Ra=transpose(createR(Vector3d(x[0], x[1], x[2])));

  for (int i=0; i<m; i++)
  {
    Matrix33d R=createR(v[i]);
    fvec[i]=recoverAngleAxis(Ra*R, tmp);
  }

  return 0;
}